

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# operator.cpp
# Opt level: O0

ResultValue * __thiscall
Operator::apply(ResultValue *__return_storage_ptr__,Operator *this,ResultValue lhs,ResultValue rhs)

{
  ResultValue __args;
  ResultValue __args_1;
  runtime_error *this_00;
  undefined8 local_70;
  undefined8 uStack_68;
  undefined8 local_60;
  undefined8 uStack_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 uStack_40;
  undefined8 local_38;
  undefined8 uStack_30;
  undefined8 local_28;
  Operator *local_10;
  Operator *this_local;
  
  local_10 = this;
  if ((this->mIsUnary & 1U) != 0) {
    this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this_00,"Not a binary operator.");
    __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  memcpy(&local_48,&lhs,0x28);
  memcpy(&local_70,&rhs,0x28);
  __args.mIntValue = uStack_40;
  __args._0_8_ = local_48;
  __args.mFloatValue = (double)local_38;
  __args.mComplexValue._M_value._0_8_ = uStack_30;
  __args.mComplexValue._M_value._8_8_ = local_28;
  __args_1.mIntValue = uStack_68;
  __args_1._0_8_ = local_70;
  __args_1.mFloatValue = (double)local_60;
  __args_1.mComplexValue._M_value._0_8_ = uStack_58;
  __args_1.mComplexValue._M_value._8_8_ = local_50;
  std::function<ResultValue_(ResultValue,_ResultValue)>::operator()
            (__return_storage_ptr__,&this->mBinaryFn,__args,__args_1);
  return __return_storage_ptr__;
}

Assistant:

ResultValue Operator::apply(ResultValue lhs, ResultValue rhs) const {
	if (mIsUnary) {
		throw std::runtime_error("Not a binary operator.");
	}

	return mBinaryFn(lhs, rhs);
}